

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O3

bool __thiscall pgn::find_move<(Piece)4>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  Square *pSVar1;
  U8 UVar2;
  byte bVar3;
  Square SVar4;
  bool bVar5;
  U64 UVar6;
  U64 UVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  U8 *pUVar11;
  Square *s;
  Move *m_00;
  long lVar12;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  if (*local_3a8.queens != no_square) {
    s = local_3a8.queens;
    do {
      UVar6 = magics::attacks<(Piece)2>(&local_3a8.all_pieces,s);
      UVar7 = magics::attacks<(Piece)3>(&local_3a8.all_pieces,s);
      uVar9 = local_3a8.qtarget & (UVar7 | UVar6);
      if (uVar9 != 0) {
        SVar4 = *s;
        uVar10 = (ulong)local_3a8.last;
        pUVar11 = &local_3a8.list[uVar10].type;
        do {
          lVar12 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          ((Move *)(pUVar11 + -2))->f = (char)SVar4;
          pUVar11[-1] = (U8)lVar12;
          *pUVar11 = '\n';
          pUVar11 = pUVar11 + 3;
          local_3a8.last = (int)uVar10 + 1;
          uVar10 = (ulong)(uint)local_3a8.last;
          uVar9 = uVar9 & uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar9 = (UVar7 | UVar6) & local_3a8.ctarget;
      if (uVar9 != 0) {
        SVar4 = *s;
        uVar10 = (ulong)local_3a8.last;
        pUVar11 = &local_3a8.list[uVar10].type;
        do {
          lVar12 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          ((Move *)(pUVar11 + -2))->f = (char)SVar4;
          pUVar11[-1] = (U8)lVar12;
          *pUVar11 = '\v';
          pUVar11 = pUVar11 + 3;
          local_3a8.last = (int)uVar10 + 1;
          uVar10 = (ulong)(uint)local_3a8.last;
          uVar9 = uVar9 & uVar9 - 1;
        } while (uVar9 != 0);
      }
      pSVar1 = s + 1;
      s = s + 1;
    } while (*pSVar1 != no_square);
  }
  if (0 < local_3a8.last) {
    UVar2 = m->type;
    m_00 = local_3a8.list;
    lVar12 = 0;
    do {
      bVar5 = position::is_legal(p,m_00);
      if (bVar5) {
        if (UVar2 == '\x11') {
          bVar3 = m_00->t;
          if (*to == (uint)bVar3) {
            if (((row < 0) || (bVar8 = m_00->f, (uint)(bVar8 >> 3) != row)) &&
               ((col < 0 || (bVar8 = m_00->f, (bVar8 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e6f4;
              m->f = m_00->f;
            }
            else {
              m->f = bVar8;
            }
            m->t = bVar3;
            m->type = m_00->type;
LAB_0011e75c:
            bVar5 = true;
            goto LAB_0011e70b;
          }
        }
        else if ((m->type == m_00->type) && (bVar3 = m_00->t, *to == (uint)bVar3)) {
          if (((row < 0) || (bVar8 = m_00->f, (uint)(bVar8 >> 3) != row)) &&
             ((col < 0 || (bVar8 = m_00->f, (bVar8 & 7) != col)))) {
            if (-1 < (col & row)) goto LAB_0011e6f4;
            m->f = m_00->f;
          }
          else {
            m->f = bVar8;
          }
          m->t = bVar3;
          goto LAB_0011e75c;
        }
      }
LAB_0011e6f4:
      lVar12 = lVar12 + 1;
      m_00 = m_00 + 1;
    } while (lVar12 < local_3a8.last);
  }
  bVar5 = false;
LAB_0011e70b:
  Movegen::~Movegen(&local_3a8);
  return bVar5;
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}